

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filesystem.cc
# Opt level: O0

void phosg::save_file(string *filename,void *data,size_t size)

{
  int __fd;
  int *piVar1;
  runtime_error *prVar2;
  char *pcVar3;
  uint *puVar4;
  int error;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 local_61;
  string local_60;
  size_t local_30;
  ssize_t bytes_written;
  size_t sStack_20;
  scoped_fd fd;
  size_t size_local;
  void *data_local;
  string *filename_local;
  
  sStack_20 = size;
  scoped_fd::scoped_fd((scoped_fd *)((long)&bytes_written + 4),filename,0x241,0x1ed);
  __fd = scoped_fd::operator_cast_to_int((scoped_fd *)((long)&bytes_written + 4));
  local_30 = write(__fd,data,sStack_20);
  if (local_30 == sStack_20) {
    scoped_fd::~scoped_fd((scoped_fd *)((long)&bytes_written + 4));
    return;
  }
  piVar1 = __errno_location();
  if (*piVar1 == 0) {
    local_61 = 1;
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    pcVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                       (filename);
    string_printf_abi_cxx11_
              (&local_60,"can\'t write to %s: %zd/%zd bytes written",pcVar3,local_30,sStack_20);
    ::std::runtime_error::runtime_error(prVar2,(string *)&local_60);
    local_61 = 0;
    __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::operator+(&local_c8,"can\'t write to ",filename);
  ::std::operator+(&local_a8,&local_c8,": ");
  puVar4 = (uint *)__errno_location();
  string_for_error_abi_cxx11_(&local_e8,(phosg *)(ulong)*puVar4,error);
  ::std::operator+(&local_88,&local_a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e8);
  ::std::runtime_error::runtime_error(prVar2,(string *)&local_88);
  __cxa_throw(prVar2,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void save_file(const string& filename, const void* data, size_t size) {
  scoped_fd fd(filename, O_CREAT | O_TRUNC | O_WRONLY);
  ssize_t bytes_written = write(fd, data, size);
  if (bytes_written != static_cast<ssize_t>(size)) {
    if (errno == 0) {
      throw runtime_error(string_printf("can\'t write to %s: %zd/%zd bytes written",
          filename.c_str(), bytes_written, size));
    } else {
      throw runtime_error("can\'t write to " + filename + ": " + string_for_error(errno));
    }
  }
}